

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::detail::ReferenceResolver::_store_anchors_and_refs(ReferenceResolver *this,size_t n)

{
  ulong uVar1;
  NodeType_e NVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  csubstr *pcVar6;
  csubstr *pcVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  Tree *pTVar11;
  Tree *pTVar12;
  Tree *this_00;
  refdata local_60;
  
  pTVar12 = this->t;
  if ((n == 0xffffffffffffffff) || (pTVar11 = pTVar12, pTVar12->m_cap <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fa88a;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar11 = this->t;
  }
  this_00 = pTVar11;
  if ((pTVar12->m_buf[n].m_type.type & KEYREF) == NOTYPE) {
    if ((n == 0xffffffffffffffff) || (pTVar12 = pTVar11, pTVar11->m_cap <= n)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x4b86;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fa88a;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pTVar12 = this->t;
    }
    this_00 = pTVar12;
    if ((pTVar11->m_buf[n].m_type.type & VALREF) == NOTYPE) {
      if ((n == 0xffffffffffffffff) || (pTVar12->m_cap <= n)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x4b86;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fa88a;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023c518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
        this_00 = this->t;
      }
      if ((pTVar12->m_buf[n].m_type.type & KEY) == NOTYPE) goto LAB_001edf91;
      pcVar6 = Tree::key(this_00,n);
      iVar5 = basic_substring<const_char>::compare(pcVar6,"<<",2);
      this_00 = this->t;
      if (iVar5 != 0) goto LAB_001edf91;
    }
  }
  if ((n == 0xffffffffffffffff) || (this_00->m_cap <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fa88a;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pTVar12 = this->t;
  if ((this_00->m_buf[n].m_type.type & SEQ) != NOTYPE) {
    sVar9 = Tree::first_child(pTVar12,n);
    if (sVar9 == 0xffffffffffffffff) {
      return;
    }
    do {
      sVar8 = Tree::num_children(this->t,sVar9);
      if (sVar8 != 0) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x66c0;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fa88a;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023c518)
                  ("check failed: t->num_children(ich) == 0",0x27,
                   (anonymous_namespace)::s_default_callbacks);
      }
      local_60.type.type = VALREF;
      local_60.prev_anchor = 0xffffffffffffffff;
      local_60.target = 0xffffffffffffffff;
      local_60.node = sVar9;
      local_60.parent_ref = n;
      local_60.parent_ref_sibling = Tree::next_sibling(this->t,n);
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
      sVar9 = Tree::next_sibling(this->t,sVar9);
      if (sVar9 == 0xffffffffffffffff) {
        return;
      }
    } while( true );
  }
  if ((n == 0xffffffffffffffff) || (pTVar11 = pTVar12, pTVar12->m_cap <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fa88a;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar11 = this->t;
  }
  if ((pTVar12->m_buf[n].m_type.type & KEYREF) != NOTYPE) {
    pcVar6 = Tree::key(pTVar11,n);
    iVar5 = basic_substring<const_char>::compare(pcVar6,"<<",2);
    pTVar11 = this->t;
    if (iVar5 != 0) {
      if ((n == 0xffffffffffffffff) || (pTVar11->m_cap <= n)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x4b86;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fa88a;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023c518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar11->m_buf[n].m_type.type & KEY) != NOTYPE) {
        pcVar6 = Tree::key(this->t,n);
        pcVar7 = Tree::key_ref(this->t,n);
        uVar1 = pcVar7->len;
        if (pcVar6->len < uVar1) {
LAB_001edbba:
          if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_60.type.type = NOTYPE;
          local_60.node = 0x66c7;
          local_60.prev_anchor = 0;
          local_60.target = 0x1fa88a;
          local_60.parent_ref = 0x65;
          (*(code *)PTR_error_impl_0023c518)
                    ("check failed: (!t->has_key(n)) || t->key(n).ends_with(t->key_ref(n))",0x44,
                     (anonymous_namespace)::s_default_callbacks);
        }
        else if (uVar1 != 0) {
          uVar10 = 0;
          do {
            if (pcVar6->str[uVar10 + (pcVar6->len - uVar1)] != pcVar7->str[uVar10])
            goto LAB_001edbba;
            uVar10 = uVar10 + 1;
          } while (uVar1 != uVar10);
        }
      }
      local_60.type.type = KEYREF;
      local_60.prev_anchor = 0xffffffffffffffff;
      local_60.target = 0xffffffffffffffff;
      local_60.parent_ref = 0xffffffffffffffff;
      local_60.parent_ref_sibling = 0xffffffffffffffff;
      local_60.node = n;
      stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
      pTVar11 = this->t;
    }
  }
  if ((n == 0xffffffffffffffff) || (this_00 = pTVar11, pTVar11->m_cap <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fa88a;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    this_00 = this->t;
  }
  if ((pTVar11->m_buf[n].m_type.type & VALREF) != NOTYPE) {
    if ((n == 0xffffffffffffffff) || (this_00->m_cap <= n)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x4b86;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fa88a;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((this_00->m_buf[n].m_type.type & VAL) != NOTYPE) {
      pcVar6 = Tree::val(this->t,n);
      pcVar7 = Tree::val_ref(this->t,n);
      uVar1 = pcVar7->len;
      if (pcVar6->len < uVar1) {
LAB_001edecd:
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x66cc;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fa88a;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023c518)
                  ("check failed: (!t->has_val(n)) || t->val(n).ends_with(t->val_ref(n))",0x44,
                   (anonymous_namespace)::s_default_callbacks);
      }
      else if (uVar1 != 0) {
        uVar10 = 0;
        do {
          if (pcVar6->str[uVar10 + (pcVar6->len - uVar1)] != pcVar7->str[uVar10]) goto LAB_001edecd;
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
    }
    local_60.type.type = VALREF;
    local_60.prev_anchor = 0xffffffffffffffff;
    local_60.target = 0xffffffffffffffff;
    local_60.parent_ref = 0xffffffffffffffff;
    local_60.parent_ref_sibling = 0xffffffffffffffff;
    local_60.node = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
    this_00 = this->t;
  }
LAB_001edf91:
  if ((n == 0xffffffffffffffff) || (pTVar12 = this_00, this_00->m_cap <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fa88a;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar12 = this->t;
  }
  if ((~(int)this_00->m_buf[n].m_type.type & 0x102U) == 0) {
    if ((n == 0xffffffffffffffff) || (pTVar12->m_cap <= n)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x4b86;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fa88a;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar12->m_buf[n].m_type.type & KEY) == NOTYPE) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x66d2;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fa88a;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: t->has_key(n)",0x1b,(anonymous_namespace)::s_default_callbacks);
    }
    local_60.type.type = KEYANCH;
    local_60.prev_anchor = 0xffffffffffffffff;
    local_60.target = 0xffffffffffffffff;
    local_60.parent_ref = 0xffffffffffffffff;
    local_60.parent_ref_sibling = 0xffffffffffffffff;
    local_60.node = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
    pTVar12 = this->t;
  }
  if ((n == 0xffffffffffffffff) || (pTVar11 = pTVar12, pTVar12->m_cap <= n)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_60.type.type = NOTYPE;
    local_60.node = 0x4b86;
    local_60.prev_anchor = 0;
    local_60.target = 0x1fa88a;
    local_60.parent_ref = 0x65;
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar11 = this->t;
  }
  NVar2 = pTVar12->m_buf[n].m_type.type;
  if ((NVar2 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar2 >> 9 & 1) != 0) {
    if ((n == 0xffffffffffffffff) || (pTVar11->m_cap <= n)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_60.type.type = NOTYPE;
      local_60.node = 0x4b86;
      local_60.prev_anchor = 0;
      local_60.target = 0x1fa88a;
      local_60.parent_ref = 0x65;
      (*(code *)PTR_error_impl_0023c518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((pTVar11->m_buf[n].m_type.type & VAL) == NOTYPE) {
      pTVar12 = this->t;
      if ((n == 0xffffffffffffffff) || (pTVar12->m_cap <= n)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x4b86;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fa88a;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023c518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((pTVar12->m_buf[n].m_type.type & (STREAM|MAP)) == NOTYPE) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_60.type.type = NOTYPE;
        local_60.node = 0x66d7;
        local_60.prev_anchor = 0;
        local_60.target = 0x1fa88a;
        local_60.parent_ref = 0x65;
        (*(code *)PTR_error_impl_0023c518)
                  ("check failed: t->has_val(n) || t->is_container(n)",0x31,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    local_60.type.type = VALANCH;
    local_60.prev_anchor = 0xffffffffffffffff;
    local_60.target = 0xffffffffffffffff;
    local_60.parent_ref = 0xffffffffffffffff;
    local_60.parent_ref_sibling = 0xffffffffffffffff;
    local_60.node = n;
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::push(&this->refs,&local_60);
    pTVar11 = this->t;
  }
  for (sVar9 = Tree::first_child(pTVar11,n); sVar9 != 0xffffffffffffffff;
      sVar9 = Tree::next_sibling(this->t,sVar9)) {
    _store_anchors_and_refs(this,sVar9);
  }
  return;
}

Assistant:

void _store_anchors_and_refs(size_t n)
    {
        if(t->is_key_ref(n) || t->is_val_ref(n) || (t->has_key(n) && t->key(n) == "<<"))
        {
            if(t->is_seq(n))
            {
                // for merging multiple inheritance targets
                //   <<: [ *CENTER, *BIG ]
                for(size_t ich = t->first_child(n); ich != NONE; ich = t->next_sibling(ich))
                {
                    RYML_ASSERT(t->num_children(ich) == 0);
                    refs.push({VALREF, ich, npos, npos, n, t->next_sibling(n)});
                }
                return;
            }
            if(t->is_key_ref(n) && t->key(n) != "<<") // insert key refs BEFORE inserting val refs
            {
                RYML_CHECK((!t->has_key(n)) || t->key(n).ends_with(t->key_ref(n)));
                refs.push({KEYREF, n, npos, npos, NONE, NONE});
            }
            if(t->is_val_ref(n))
            {
                RYML_CHECK((!t->has_val(n)) || t->val(n).ends_with(t->val_ref(n)));
                refs.push({VALREF, n, npos, npos, NONE, NONE});
            }
        }
        if(t->has_key_anchor(n))
        {
            RYML_CHECK(t->has_key(n));
            refs.push({KEYANCH, n, npos, npos, NONE, NONE});
        }
        if(t->has_val_anchor(n))
        {
            RYML_CHECK(t->has_val(n) || t->is_container(n));
            refs.push({VALANCH, n, npos, npos, NONE, NONE});
        }
        for(size_t ch = t->first_child(n); ch != NONE; ch = t->next_sibling(ch))
        {
            _store_anchors_and_refs(ch);
        }
    }